

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lzop.c
# Opt level: O2

int archive_write_lzop_open(archive_write_filter *f)

{
  int *piVar1;
  int iVar2;
  archive_string local_38;
  
  piVar1 = (int *)f->data;
  local_38.s = (char *)0x0;
  local_38.length = 0;
  local_38.buffer_length = 0;
  archive_strncat(&local_38,"lzop",4);
  if (0 < *piVar1) {
    archive_strappend_char(&local_38,' ');
    archive_strappend_char(&local_38,'-');
    archive_strappend_char(&local_38,(char)*piVar1 + '0');
  }
  iVar2 = __archive_write_program_open(f,*(archive_write_program_data **)(piVar1 + 2),local_38.s);
  archive_string_free(&local_38);
  return iVar2;
}

Assistant:

static int
archive_write_lzop_open(struct archive_write_filter *f)
{
	struct write_lzop *data = (struct write_lzop *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "lzop");
	/* Specify compression level. */
	if (data->compression_level > 0) {
		archive_strappend_char(&as, ' ');
		archive_strappend_char(&as, '-');
		archive_strappend_char(&as, '0' + data->compression_level);
	}

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}